

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfFrameBuffer.cpp
# Opt level: O0

Slice * Imf_3_3::Slice::Make
                  (PixelType type,void *ptr,V2i *origin,int64_t w,int64_t h,size_t xStride,
                  size_t yStride,int xSampling,int ySampling,double fillValue,bool xTileCoords,
                  bool yTileCoords)

{
  undefined8 uVar1;
  int *in_RCX;
  long in_RDX;
  PixelType in_ESI;
  Slice *in_RDI;
  long in_R8;
  double in_XMM0_Qa;
  size_t in_stack_00000008;
  size_t in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  byte in_stack_00000028;
  byte in_stack_00000030;
  int64_t offy;
  int64_t offx;
  stringstream _iex_throw_s;
  intptr_t base;
  undefined4 in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdcc;
  undefined4 in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd4;
  stringstream local_1c8 [16];
  ostream local_1b8 [390];
  undefined1 local_32;
  undefined1 local_31;
  
  local_31 = in_stack_00000028 & 1;
  local_32 = in_stack_00000030 & 1;
  if (in_stack_00000008 == 0) {
    switch(in_ESI) {
    case UINT:
      in_stack_00000008 = 4;
      break;
    case HALF:
      in_stack_00000008 = 2;
      break;
    case FLOAT:
      in_stack_00000008 = 4;
      break;
    case NUM_PIXELTYPES:
      iex_debugTrap();
      std::__cxx11::stringstream::stringstream(local_1c8);
      std::operator<<(local_1b8,"Invalid pixel type.");
      uVar1 = __cxa_allocate_exception(0x48);
      Iex_3_3::ArgExc::ArgExc
                ((ArgExc *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                 (stringstream *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
      __cxa_throw(uVar1,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
    }
  }
  if (in_stack_00000010 == 0) {
    in_stack_00000010 = (in_R8 / (long)in_stack_00000018) * in_stack_00000008;
  }
  Slice(in_RDI,in_ESI,
        (char *)((in_RDX - in_stack_00000008 * ((long)*in_RCX / (long)in_stack_00000018)) -
                in_stack_00000010 * ((long)in_RCX[1] / (long)in_stack_00000020)),in_stack_00000008,
        in_stack_00000010,in_stack_00000018,in_stack_00000020,in_XMM0_Qa,(bool)local_31,
        (bool)local_32);
  return in_RDI;
}

Assistant:

Slice
Slice::Make (
    PixelType                   type,
    const void*                 ptr,
    const IMATH_NAMESPACE::V2i& origin,
    int64_t                     w,
    int64_t                     h,
    size_t                      xStride,
    size_t                      yStride,
    int                         xSampling,
    int                         ySampling,
    double                      fillValue,
    bool                        xTileCoords,
    bool                        yTileCoords)
{
    intptr_t base = reinterpret_cast<intptr_t> (const_cast<void*> (ptr));
    if (xStride == 0)
    {
        switch (type)
        {
            case UINT: xStride = sizeof (uint32_t); break;
            case HALF: xStride = sizeof (uint16_t); break;
            case FLOAT: xStride = sizeof (float); break;
            case NUM_PIXELTYPES:
                THROW (IEX_NAMESPACE::ArgExc, "Invalid pixel type.");
        }
    }
    if (yStride == 0) yStride = static_cast<size_t> (w / xSampling) * xStride;

    // data window is an int, so force promote to higher type to avoid
    // overflow for off y (degenerate size checks should be in
    // ImfHeader::sanityCheck, but offset can be large-ish)
    int64_t offx =
        (static_cast<int64_t> (origin.x) / static_cast<int64_t> (xSampling));
    offx *= static_cast<int64_t> (xStride);

    int64_t offy =
        (static_cast<int64_t> (origin.y) / static_cast<int64_t> (ySampling));
    offy *= static_cast<int64_t> (yStride);

    return Slice (
        type,
        reinterpret_cast<char*> (base - offx - offy),
        xStride,
        yStride,
        xSampling,
        ySampling,
        fillValue,
        xTileCoords,
        yTileCoords);
}